

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_predict_threaded.cc
# Opt level: O2

void __thiscall Worker::operator()(Worker *this)

{
  pointer pdVar1;
  Worker *pWVar2;
  int iVar3;
  vw *pvVar4;
  ezexample *peVar5;
  ostream *poVar6;
  float fVar7;
  allocator local_245;
  int local_244;
  double local_240;
  int local_234;
  Worker *local_230;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ezexample ex;
  
  std::__cxx11::string::string((string *)&local_228,(string *)this->vw_init_string);
  pvVar4 = VW::initialize(&local_228,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  this->m_vw_parser = pvVar4;
  std::__cxx11::string::~string((string *)&local_228);
  local_230 = this;
  if (this->m_vw_parser != (vw *)0x0) {
    local_244 = 0;
    iVar3 = 0;
    while (iVar3 < runcount) {
      pdVar1 = (local_230->m_referenceValues->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_234 = iVar3;
      ezexample::ezexample(&ex,local_230->m_vw,false,local_230->m_vw_parser);
      ezexample::addns(&ex,'s');
      peVar5 = ezexample::operator()(&ex,"p^the_man");
      peVar5 = ezexample::operator()(peVar5,"w^the");
      peVar5 = ezexample::operator()(peVar5,"w^man");
      ezexample::addns(peVar5,'t');
      peVar5 = ezexample::operator()(peVar5,"p^le_homme");
      peVar5 = ezexample::operator()(peVar5,"w^le");
      ezexample::operator()(peVar5,"w^homme");
      std::__cxx11::string::string((string *)&local_1c8,"1",&local_245);
      ezexample::set_label(&ex,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      local_240 = *pdVar1;
      fVar7 = ezexample::predict(&ex);
      if ((local_240 != (double)fVar7) || (NAN(local_240) || NAN((double)fVar7))) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"fail!");
        std::endl<char,std::char_traits<char>>(poVar6);
        local_244 = local_244 + 1;
      }
      ezexample::remns(&ex);
      ezexample::addns(&ex,'t');
      peVar5 = ezexample::operator()(&ex,"p^un_homme");
      peVar5 = ezexample::operator()(peVar5,"w^un");
      ezexample::operator()(peVar5,"w^homme");
      std::__cxx11::string::string((string *)&local_1e8,"1",&local_245);
      ezexample::set_label(&ex,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      local_240 = pdVar1[1];
      fVar7 = ezexample::predict(&ex);
      if ((local_240 != (double)fVar7) || (NAN(local_240) || NAN((double)fVar7))) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"fail!");
        std::endl<char,std::char_traits<char>>(poVar6);
        local_244 = local_244 + 1;
      }
      ezexample::remns(&ex);
      peVar5 = ezexample::operator()(&ex,'t',"p^un_homme");
      peVar5 = ezexample::operator()(peVar5,'t',"w^un");
      ezexample::operator()(peVar5,'t',"w^homme");
      std::__cxx11::string::string((string *)&local_208,"1",&local_245);
      ezexample::set_label(&ex,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      local_240 = pdVar1[2];
      fVar7 = ezexample::predict(&ex);
      if ((local_240 != (double)fVar7) || (NAN(local_240) || NAN((double)fVar7))) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"fail!");
        std::endl<char,std::char_traits<char>>(poVar6);
        local_244 = local_244 + 1;
      }
      ezexample::~ezexample(&ex);
      iVar3 = local_234 + 1;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"error count = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_244);
    std::endl<char,std::char_traits<char>>(poVar6);
    pWVar2 = local_230;
    VW::finish(local_230->m_vw_parser,true);
    pWVar2->m_vw_parser = (vw *)0x0;
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"cannot initialize vw parser");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

void operator()()
  { m_vw_parser = VW::initialize(vw_init_string);
    if (m_vw_parser == NULL)
    { cerr << "cannot initialize vw parser" << endl;
      exit(-1);
    }

    int errorCount = 0;
    for (int i = 0; i < runcount; ++i)
    { vector<double>::iterator it = m_referenceValues.begin();
      ezexample ex(&m_vw, false, m_vw_parser);

      ex(vw_namespace('s'))
      ("p^the_man")
      ("w^the")
      ("w^man")
      (vw_namespace('t'))
      ("p^le_homme")
      ("w^le")
      ("w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      //if (*it != pred) { cerr << "fail!" << endl; ++errorCount; }
      //VW::finish_example(m_vw, vec2);
      ++it;

      --ex;   // remove the most recent namespace
      ex(vw_namespace('t'))
      ("p^un_homme")
      ("w^un")
      ("w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      ++it;

      --ex;   // remove the most recent namespace
      // add features with explicit ns
      ex('t', "p^un_homme")
      ('t', "w^un")
      ('t', "w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      ++it;

      //cout << "."; cout.flush();
    }
    cerr << "error count = " << errorCount << endl;
    VW::finish(*m_vw_parser);
    m_vw_parser = NULL;
  }